

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_aerial_transferrence(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ulong uVar1;
  CHAR_DATA *pCVar2;
  bool bVar3;
  ROOM_INDEX_DATA *pRVar4;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var5;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *wch_next;
  CHAR_DATA *wch;
  CHAR_DATA *anchor;
  undefined1 in_stack_000012f2;
  undefined1 in_stack_000012f3;
  int in_stack_000012f4;
  int in_stack_000012f8;
  int in_stack_000012fc;
  CHAR_DATA *in_stack_00001300;
  CHAR_DATA *in_stack_00001308;
  int in_stack_00001328;
  int in_stack_00001330;
  char *in_stack_00001338;
  char *in_stack_00005bd0;
  CHAR_DATA *in_stack_00005bd8;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CHAR_DATA *in_stack_ffffffffffffff90;
  CHAR_DATA *pCVar6;
  ROOM_INDEX_DATA *in_stack_ffffffffffffffa8;
  CHAR_DATA *in_stack_ffffffffffffffb0;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *ch_00;
  CHAR_DATA *local_28;
  
  local_28 = (CHAR_DATA *)0x0;
  uVar1 = in_RDX->in_room->room_flags[0];
  _Var5 = std::pow<int,int>(0,0x6dbf54);
  if ((((uVar1 & (long)_Var5) == 0) && (in_RDX->in_room->sector_type != 7)) &&
     (in_RDX->in_room->sector_type != 8)) {
    bVar3 = is_affected(in_RDX,(int)gsn_bind_feet);
    pCVar6 = char_list;
    if (bVar3) {
      send_to_char((char *)in_stack_ffffffffffffff90,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    else {
      do {
        ch_00 = pCVar6;
        pCVar2 = local_28;
        if (ch_00 == (CHAR_DATA *)0x0) break;
        in_stack_ffffffffffffffc8 = ch_00->next;
        bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        pCVar6 = in_stack_ffffffffffffffc8;
      } while (((!bVar3) || (pCVar6 = in_stack_ffffffffffffffc8, ch_00->pIndexData->vnum != 0xb8e))
              || (pCVar6 = in_stack_ffffffffffffffc8, pCVar2 = ch_00, ch_00->hunting != in_RDX));
      local_28 = pCVar2;
      if (local_28 == (CHAR_DATA *)0x0) {
        do {
          do {
            do {
              pRVar4 = get_random_room(in_stack_ffffffffffffffc8);
            } while (pRVar4->sector_type == 1);
          } while (((pRVar4->sector_type == 7) || (pRVar4->sector_type == 6)) ||
                  (pRVar4->sector_type == 8));
          pCVar6 = (CHAR_DATA *)pRVar4->room_flags[0];
          _Var5 = std::pow<int,int>(0,0x6dc189);
        } while (((((ulong)pCVar6 & (long)_Var5) != 0) ||
                 (bVar3 = is_explore((ROOM_INDEX_DATA *)
                                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
                 bVar3)) || (pRVar4->cabal != 0));
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        char_from_room(ch_00);
        char_to_room(pCVar6,in_stack_ffffffffffffffa8);
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        do_look(in_stack_00005bd8,in_stack_00005bd0);
        dice(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        pCVar6 = (CHAR_DATA *)0x0;
        damage_new(in_stack_00001308,in_stack_00001300,in_stack_000012fc,in_stack_000012f8,
                   in_stack_000012f4,(bool)in_stack_000012f3,(bool)in_stack_000012f2,
                   in_stack_00001328,in_stack_00001330,in_stack_00001338);
        check_plasma_thread(pCVar6,in_stack_ffffffffffffff8c);
      }
      else {
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        char_from_room(ch_00);
        char_to_room(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        do_look(in_stack_00005bd8,in_stack_00005bd0);
        check_plasma_thread(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
    }
  }
  else {
    send_to_char((char *)in_stack_ffffffffffffff90,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  return;
}

Assistant:

void spell_aerial_transferrence(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *anchor = nullptr, *wch, *wch_next;
	ROOM_INDEX_DATA *pRoomIndex;

	if (IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL)
		|| ch->in_room->sector_type == SECT_INSIDE
		|| ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast that here.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", ch);
		return;
	}

	for (wch = char_list; wch != nullptr; wch = wch_next)
	{
		wch_next = wch->next;

		if (is_npc(wch) && wch->pIndexData->vnum == MOB_VNUM_ANCHOR && wch->hunting == ch)
		{
			anchor = wch;
			break;
		}
	}

	if (anchor)
	{
		act("As you call upon the power of the winds, a large funnel cloud materializes to carry you off into the air!", ch, 0, 0, TO_CHAR);
		act("A large funnel cloud materializes out of nowhere and carries $n soaring into the sky!", ch, 0, 0, TO_ROOM);

		char_from_room(ch);
		char_to_room(ch, anchor->in_room);

		act("You soar through the air and are soon set down beside your anchor.", ch, 0, 0, TO_CHAR);
		act("$n suddenly drops gently to the ground, beside the small funnel cloud.", ch, 0, 0, TO_ROOM);

		do_look(ch, "auto");
		check_plasma_thread(ch, -1);
	}
	else
	{
		for (;;)
		{
			pRoomIndex = get_random_room(ch);

			if (pRoomIndex->sector_type == SECT_CITY
				|| pRoomIndex->sector_type == SECT_INSIDE
				|| pRoomIndex->sector_type == SECT_WATER
				|| pRoomIndex->sector_type == SECT_UNDERWATER)
			{
				continue;
			}

			if (!IS_SET(pRoomIndex->room_flags, ROOM_NO_RECALL) && !is_explore(pRoomIndex) && !pRoomIndex->cabal)
				break;
		}

		act("As you call upon the power of the winds, a large funnel cloud materializes to carry you off into the air!", ch, 0, 0, TO_CHAR);
		act("A large funnel cloud materializes out of nowhere and carries $n soaring into the sky!", ch, 0, 0, TO_ROOM);

		char_from_room(ch);
		char_to_room(ch, pRoomIndex);

		act("Without an anchor to secure you, the winds fling you haphazardly through the sky! ", ch, 0, 0, TO_CHAR);
		act("$n plummets suddenly from the sky, hitting the ground hard!", ch, 0, 0, TO_ROOM);

		do_look(ch, "auto");
		damage_new(ch, ch, dice(10, 10), sn, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
		check_plasma_thread(ch, -1);
	}
}